

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O3

void __thiscall
QIBusPlatformInputContext::commitText(QIBusPlatformInputContext *this,QDBusVariant *text)

{
  long lVar1;
  QArrayData *pQVar2;
  QMetaType QVar3;
  QDebug this_00;
  bool bVar4;
  QObject *pQVar5;
  QMetaType QVar6;
  undefined8 *puVar7;
  QDBusArgumentPrivate *pQVar8;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QInputMethodEvent event;
  QDBusArgument arg;
  QIBusText t;
  QString local_138;
  char *pcStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  QDebug local_d0;
  QDBusArgument local_c8;
  QString local_c0;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  QHash<QString,_QDBusArgument> QStack_90;
  QArrayData *local_88;
  undefined8 *puStack_80;
  undefined8 local_78;
  QArrayData *pQStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QHash<QString,_QDBusArgument> local_58;
  QArrayDataPointer<QIBusAttribute> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QObject *)QGuiApplication::focusObject();
  if (pQVar5 != (QObject *)0x0) {
    local_c8.d = (QDBusArgumentPrivate *)0xaaaaaaaaaaaaaaaa;
    this_01 = &local_a8;
    QVariant::QVariant((QVariant *)this_01,&text->m_variant);
    local_138.d.d._0_4_ = 0x12a2a8;
    local_138.d.d._4_4_ = 0;
    local_c0.d.d = (Data *)((ulong)QStack_90.d & 0xfffffffffffffffc);
    bVar4 = comparesEqual((QMetaType *)&local_c0,(QMetaType *)&local_138);
    if (bVar4) {
      if (((ulong)QStack_90.d & 1) == 0) {
        local_c8.d = (QDBusArgumentPrivate *)local_a8.shared;
        local_a8.shared = (PrivateShared *)0x0;
      }
      else {
        pQVar8 = (QDBusArgumentPrivate *)(local_a8.shared + *(int *)(local_a8.shared + 4));
        if (*(int *)local_a8.shared == 1) {
          local_c8.d = *(QDBusArgumentPrivate **)pQVar8;
          *(undefined8 *)pQVar8 = 0;
        }
        else {
          QDBusArgument::QDBusArgument(&local_c8,(QDBusArgument *)pQVar8);
        }
      }
    }
    else {
      local_c8.d = (QDBusArgumentPrivate *)0xaaaaaaaaaaaaaaaa;
      QDBusArgument::QDBusArgument(&local_c8);
      QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((ulong)QStack_90.d & 1) != 0) {
        this_01 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_a8.shared + *(int *)(local_a8.shared + 4));
      }
      QVar3.d_ptr._4_4_ = local_138.d.d._4_4_;
      QVar3.d_ptr._0_4_ = local_138.d.d._0_4_;
      QMetaType::convert(QVar6,this_01,QVar3,&local_c8);
    }
    QVariant::~QVariant((QVariant *)&local_a8);
    QStack_50.ptr = (QIBusAttribute *)0xaaaaaaaaaaaaaaaa;
    QStack_50.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QStack_50.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68 = 0xaaaaaaaaaaaaaaaa;
    uStack_60 = 0xaaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaaaaaaaaaa;
    pQStack_70 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
    local_88 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
    puStack_80 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
    local_a8._16_8_ = 0xaaaaaaaaaaaaaaaa;
    QStack_90.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_a8._8_8_ = 0xaaaaaaaaaaaaaaaa;
    QIBusText::QIBusText((QIBusText *)&local_a8);
    lcQpaInputMethods();
    if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_138.d.d._0_4_ = 2;
      local_138.d.d._4_4_ = 0;
      local_138.d.ptr._0_4_ = 0;
      local_138.d.ptr._4_4_ = 0;
      local_138.d.size._0_4_ = 0;
      local_138.d.size._4_4_ = 0;
      pcStack_120 = lcQpaInputMethods::category.name;
      QMessageLogger::debug();
      QDBusArgument::currentSignature();
      if (local_c0.d.ptr == (char16_t *)0x0) {
        local_c0.d.ptr = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_d0,(ulong)local_c0.d.ptr);
      if (*(QTextStream *)(local_d0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_d0.stream,' ');
      }
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug(&local_d0);
    }
    QIBusText::deserializeFrom((QIBusText *)&local_a8,&local_c8);
    lcQpaInputMethods();
    if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_138.d.d._0_4_ = 2;
      local_138.d.d._4_4_ = 0;
      local_138.d.ptr._0_4_ = 0;
      local_138.d.ptr._4_4_ = 0;
      local_138.d.size._0_4_ = 0;
      local_138.d.size._4_4_ = 0;
      pcStack_120 = lcQpaInputMethods::category.name;
      QMessageLogger::debug();
      this_00.stream = local_d0.stream;
      QVar9.m_data = (storage_type *)0xc;
      QVar9.m_size = (qsizetype)&local_c0;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)this_00.stream,&local_c0);
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_d0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_d0.stream,' ');
      }
      puVar7 = puStack_80;
      if (puStack_80 == (undefined8 *)0x0) {
        puVar7 = &QString::_empty;
      }
      QDebug::putString((QChar *)&local_d0,(ulong)puVar7);
      if (*(QTextStream *)(local_d0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_d0.stream,' ');
      }
      QDebug::~QDebug(&local_d0);
    }
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    uStack_e0 = 0xaaaaaaaaaaaaaaaa;
    local_f8 = 0xaaaaaaaaaaaaaaaa;
    uStack_f0 = 0xaaaaaaaaaaaaaaaa;
    local_108 = 0xaaaaaaaaaaaaaaaa;
    uStack_100 = 0xaaaaaaaaaaaaaaaa;
    local_118 = 0xaaaaaaaaaaaaaaaa;
    uStack_110 = 0xaaaaaaaaaaaaaaaa;
    local_138.d.size._0_4_ = 0xaaaaaaaa;
    local_138.d.size._4_4_ = 0xaaaaaaaa;
    pcStack_120 = (char *)0xaaaaaaaaaaaaaaaa;
    local_138.d.d._0_4_ = 0xaaaaaaaa;
    local_138.d.d._4_4_ = 0xaaaaaaaa;
    local_138.d.ptr._0_4_ = 0xaaaaaaaa;
    local_138.d.ptr._4_4_ = 0xaaaaaaaa;
    QInputMethodEvent::QInputMethodEvent((QInputMethodEvent *)&local_138);
    QInputMethodEvent::setCommitString(&local_138,(int)&local_88,0);
    QCoreApplication::sendEvent(pQVar5,(QEvent *)&local_138);
    lVar1 = *(long *)(this + 0x18);
    pQVar2 = *(QArrayData **)(lVar1 + 0x30);
    *(undefined8 *)(lVar1 + 0x30) = 0;
    *(undefined8 *)(lVar1 + 0x38) = 0;
    *(undefined8 *)(lVar1 + 0x40) = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QList<QInputMethodEvent::Attribute>::clear
              ((QList<QInputMethodEvent::Attribute> *)(*(long *)(this + 0x18) + 0x48));
    QInputMethodEvent::~QInputMethodEvent((QInputMethodEvent *)&local_138);
    QArrayDataPointer<QIBusAttribute>::~QArrayDataPointer(&QStack_50);
    QHash<QString,_QDBusArgument>::~QHash(&local_58);
    if (pQStack_70 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_70,2,0x10);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    QHash<QString,_QDBusArgument>::~QHash(&QStack_90);
    if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
      UNLOCK();
      if (*(int *)local_a8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_a8.shared,2,0x10);
      }
    }
    QDBusArgument::~QDBusArgument(&local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIBusPlatformInputContext::commitText(const QDBusVariant &text)
{
    QObject *input = qApp->focusObject();
    if (!input)
        return;

    const QDBusArgument arg = qvariant_cast<QDBusArgument>(text.variant());

    QIBusText t;
    qCDebug(lcQpaInputMethods) << arg.currentSignature();
    arg >> t;
    qCDebug(lcQpaInputMethods) << "commit text:" << t.text;

    QInputMethodEvent event;
    event.setCommitString(t.text);
    QCoreApplication::sendEvent(input, &event);

    d->predit = QString();
    d->attributes.clear();
}